

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::generate_parents
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *section,string *name,char parentSeparator)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t sVar4;
  pointer pbVar5;
  string *this;
  int iVar6;
  void *pvVar7;
  _Alloc_hider _Var8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  pointer local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string *local_b0;
  string local_a8;
  string local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (section->_M_dataplus)._M_p;
  local_d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_d0 = &local_c0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + section->_M_string_length);
  local_b0 = name;
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_d0,local_d0->_M_local_buf + (long)&local_c8->_M_dataplus,local_d0);
  paVar2 = &local_f8.field_2;
  if (local_d0 == &local_c0) {
    local_f8.field_2._8_8_ = local_c0._8_8_;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)local_d0;
  }
  local_f8.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_f8.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_f8._M_string_length = (size_type)local_c8;
  local_c8 = (pointer)0x0;
  local_c0._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_f8,"default");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  args = local_d8;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
  }
  if (iVar6 != 0) {
    sVar4 = section->_M_string_length;
    if ((sVar4 == 0) ||
       (pcVar3 = (section->_M_dataplus)._M_p, pvVar7 = memchr(pcVar3,(int)parentSeparator,sVar4),
       args = local_d8, (long)pvVar7 - (long)pcVar3 == -1 || pvVar7 == (void *)0x0)) {
      pcVar3 = (section->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_f8,pcVar3,pcVar3 + sVar4);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>(args,&local_f8,&local_d8);
      local_88[0].field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      _Var8._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar2) goto LAB_001a21ae;
    }
    else {
      pcVar3 = (section->_M_dataplus)._M_p;
      local_88[0]._M_dataplus._M_p = (pointer)&local_88[0].field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)local_88,pcVar3,pcVar3 + sVar4);
      split_up(&local_48,local_88,parentSeparator);
      local_f8._M_dataplus._M_p = *(pointer *)args;
      local_f8._M_string_length = *(size_type *)(args + 8);
      local_f8.field_2._M_allocated_capacity = *(undefined8 *)(args + 0x10);
      *(pointer *)args =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(args + 8) =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(args + 0x10) =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      _Var8._M_p = local_88[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88[0]._M_dataplus._M_p == &local_88[0].field_2) goto LAB_001a21ae;
    }
    operator_delete(_Var8._M_p,
                    (ulong)((long)&(((pointer)local_88[0].field_2._0_8_)->_M_dataplus)._M_p + 1));
  }
LAB_001a21ae:
  this = local_b0;
  sVar4 = local_b0->_M_string_length;
  if ((sVar4 != 0) &&
     (pcVar3 = (local_b0->_M_dataplus)._M_p, pvVar7 = memchr(pcVar3,(int)parentSeparator,sVar4),
     (long)pvVar7 - (long)pcVar3 != -1 && pvVar7 != (void *)0x0)) {
    pcVar3 = (this->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar3,pcVar3 + sVar4);
    split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_f8,&local_a8,parentSeparator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_f8._M_string_length + -0x20));
    pbVar1 = (pointer)(local_f8._M_string_length + -0x20);
    pcVar3 = (((pointer)(local_f8._M_string_length + -0x20))->_M_dataplus)._M_p;
    pbVar5 = (pointer)(local_f8._M_string_length + -0x20);
    local_f8._M_string_length = (size_type)pbVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar5->field_2) {
      operator_delete(pcVar3,(pbVar5->field_2)._M_allocated_capacity + 1);
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (args,*(undefined8 *)(args + 8),local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
  }
  remove_quotes((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)args);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)args;
}

Assistant:

CLI11_INLINE std::vector<std::string>
generate_parents(const std::string &section, std::string &name, char parentSeparator) {
    std::vector<std::string> parents;
    if(detail::to_lower(section) != "default") {
        if(section.find(parentSeparator) != std::string::npos) {
            parents = detail::split_up(section, parentSeparator);
        } else {
            parents = {section};
        }
    }
    if(name.find(parentSeparator) != std::string::npos) {
        std::vector<std::string> plist = detail::split_up(name, parentSeparator);
        name = plist.back();
        plist.pop_back();
        parents.insert(parents.end(), plist.begin(), plist.end());
    }
    // clean up quotes on the parents
    try {
        detail::remove_quotes(parents);
    } catch(const std::invalid_argument &iarg) {
        throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
    }
    return parents;
}